

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O0

int ReadHashTable(int depth,int alpha,int beta,Movement *move)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined2 uVar8;
  HashNode *pHVar10;
  HashNode hash_node;
  int i;
  int index;
  Movement *move_local;
  int beta_local;
  int alpha_local;
  int depth_local;
  
  i = 0;
  while( true ) {
    if (1 < i) {
      return 0x100000;
    }
    pHVar10 = HashTable + (int)(((uint)ZobristKey & 0xffffff) + i);
    hash_node.depth = pHVar10->depth;
    hash_node.value = pHVar10->value;
    uVar1 = pHVar10->type;
    uVar3 = (pHVar10->good_move).from;
    uVar5 = (pHVar10->good_move).to;
    uVar7 = (pHVar10->good_move).capture;
    uVar9 = (pHVar10->good_move).field_0x3;
    uVar2 = (pHVar10->good_move).value;
    uVar4 = (pHVar10->good_move).catc;
    uVar6 = (pHVar10->good_move).movec;
    uVar8 = *(undefined2 *)&(pHVar10->good_move).field_0xa;
    if (ZobristKeyCheck == pHVar10->check) break;
    i = i + 1;
  }
  if (depth < hash_node.depth) {
    if (0x26f8 < hash_node.value) {
      hash_node._8_8_ = (ulong)(uint)(hash_node.value - step) << 0x20;
    }
    if (hash_node.value < -0x26f8) {
      hash_node.value = step + hash_node.value;
    }
    if (uVar1 == 0) {
      return hash_node.value;
    }
    if ((uVar1 == 1) && (hash_node.value <= alpha)) {
      return alpha;
    }
    if ((uVar1 == 2) && (beta <= hash_node.value)) {
      return beta;
    }
  }
  move->from = uVar3;
  move->to = uVar5;
  move->capture = uVar7;
  move->field_0x3 = uVar9;
  move->value = uVar2;
  move->catc = uVar4;
  move->movec = uVar6;
  *(undefined2 *)&move->field_0xa = uVar8;
  return 0x100000;
}

Assistant:

int ReadHashTable(int depth, int alpha, int beta, Movement& move){
    int index = ZobristKey & HASHTABLE_MASK;

    for(int i = 0; i < 2; i++){
        HashNode hash_node = HashTable[index + i];
        // 判断校验值是否正确
        if(ZobristKeyCheck == hash_node.check){
            // 获取到的置换表结点的搜索深度应该较大才能认为是有效的
            if(hash_node.depth > depth){
                // 调整至相对值
                if(hash_node.value > WIN_VALUE){
                    hash_node.value -= step;
                }
                if(hash_node.value < -WIN_VALUE){
                    hash_node.value += step;
                }

                // PV结点 直接返回置换表中的值
                if(hash_node.type == hashEXACT){
                    return hash_node.value;
                }
                // alpha结点
                else if(hash_node.type == hashALPHA && hash_node.value <= alpha){
                    return alpha;
                }
                // beta结点
                else if(hash_node.type == hashBETA && hash_node.value >= beta){
                    return beta;
                }
            }
            // 读取失败就获得该局面的最佳走法
            move = hash_node.good_move;
            break;
        }
    }
    return NONE_VALUE;
}